

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_862632::X509Test_CriticalExtension_Test::TestBody
          (X509Test_CriticalExtension_Test *this)

{
  bool bVar1;
  UniquePtr<X509> UVar2;
  UniquePtr<EVP_PKEY> pkey;
  int iVar3;
  EVP_MD *pEVar4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar5;
  char *in_R9;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  AssertionResult gtest_ar;
  allocator_type local_e9;
  _Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_e8;
  string local_c8;
  AssertionResult gtest_ar_;
  UniquePtr<X509> leaf;
  int local_84;
  UniquePtr<X509> root;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<ASN1_BIT_STRING> cert_type;
  int local_64;
  tuple<x509_st_*,_bssl::internal::Deleter> local_60;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_862632 *)&key,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar1 = (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
          key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
  gtest_ar_.success_ = bVar1;
  if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)&gtest_ar_,(AssertionResult *)0x55f7b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1edc,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_c8);
    if (local_e8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_e8._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_003925c7;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  MakeTestCert((anon_unknown_dwarf_862632 *)&root,"Root","Root",
               (EVP_PKEY *)
               key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,true);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
       root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
      root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)&gtest_ar_,(AssertionResult *)0x520523,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1ee0,local_c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_e8);
LAB_00392342:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_c8);
    if (local_e8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_e8._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pkey = key;
    UVar2 = root;
    pEVar4 = EVP_sha256();
    iVar3 = X509_sign((X509 *)UVar2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                      (EVP_PKEY *)
                      pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,pEVar4);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar3 != 0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)&gtest_ar_,
                 (AssertionResult *)"X509_sign(root.get(), key.get(), EVP_sha256())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1ee1,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_e8);
      goto LAB_00392342;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    MakeTestCert((anon_unknown_dwarf_862632 *)&leaf,"Root","Leaf",
                 (EVP_PKEY *)
                 key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,false);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
         leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)&gtest_ar_,(AssertionResult *)0x4fe166,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1ee7,local_c8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
      std::__cxx11::string::~string((string *)&local_c8);
      if (local_e8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)(*local_e8._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      cert_type._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
           ASN1_BIT_STRING_new();
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (tuple<asn1_string_st_*,_bssl::internal::Deleter>)
           cert_type._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_asn1_string_st_*,_false>)0x0;
      if ((tuple<asn1_string_st_*,_bssl::internal::Deleter>)
          cert_type._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_c8,(internal *)&gtest_ar_,(AssertionResult *)"cert_type","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x1ee9,local_c8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_e8);
LAB_00392577:
        this_00 = &gtest_ar_.message_;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
        std::__cxx11::string::~string((string *)&local_c8);
        if (local_e8._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)(*local_e8._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar3 = ASN1_BIT_STRING_set_bit
                          ((ASN1_BIT_STRING *)
                           cert_type._M_t.
                           super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,0,1);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar3 != 0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_c8,(internal *)&gtest_ar_,
                     (AssertionResult *)"ASN1_BIT_STRING_set_bit(cert_type.get(), 0, 1)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1eea,local_c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_e8)
          ;
          goto LAB_00392577;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar3 = X509_add1_ext_i2d((X509 *)leaf._M_t.
                                          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,0x47
                                  ,(void *)cert_type._M_t.
                                           super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_asn1_string_st_*,_false>.
                                           _M_head_impl,1,0);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar3 != 0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_c8,(internal *)&gtest_ar_,
                     (AssertionResult *)"X509_add1_ext_i2d(leaf.get(), 71, cert_type.get(), 1, 0)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1eed,local_c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_e8)
          ;
          goto LAB_00392577;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        UVar2 = leaf;
        pEVar4 = EVP_sha256();
        iVar3 = X509_sign((X509 *)UVar2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                  ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                          (EVP_PKEY *)
                          key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,pEVar4);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar3 != 0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_c8,(internal *)&gtest_ar_,
                     (AssertionResult *)"X509_sign(leaf.get(), key.get(), EVP_sha256())","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1eee,local_c8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_e8)
          ;
          goto LAB_00392577;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        UVar2 = leaf;
        local_84 = 0x22;
        local_60.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        __l._M_len = 1;
        __l._M_array = (iterator)&local_60;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c8,__l,&local_e9);
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_38._M_unused._M_object = (void *)0x0;
        local_38._8_8_ = 0;
        local_28 = 0;
        uStack_20 = 0;
        local_64 = Verify((X509 *)UVar2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                  ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c8,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                          (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_e8,0,
                          (function<void_(x509_store_ctx_st_*)> *)&local_38);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"34","Verify(leaf.get(), {root.get()}, {}, {})",&local_84,
                   &local_64);
        std::_Function_base::~_Function_base((_Function_base *)&local_38);
        std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base(&local_e8);
        std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                  ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
        std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                  ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1ef1,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        local_84 = 0;
        local_60.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
             root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&local_60;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c8,__l_00,&local_e9);
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_64 = Verify((X509 *)leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                  _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c8,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                          (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_e8,0x10,
                          (function<void_(x509_store_ctx_st_*)> *)&local_58);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"0","Verify(leaf.get(), {root.get()}, {}, {}, 0x10)",
                   &local_84,&local_64);
        std::_Function_base::~_Function_base((_Function_base *)&local_58);
        std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base(&local_e8);
        std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                  ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
        std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                  ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c8);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_c8);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1ef3,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
          if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
          }
        }
        this_00 = &gtest_ar.message_;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&cert_type);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&leaf);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&root);
LAB_003925c7:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST(X509Test, CriticalExtension) {
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  bssl::UniquePtr<X509> root =
      MakeTestCert("Root", "Root", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root);
  ASSERT_TRUE(X509_sign(root.get(), key.get(), EVP_sha256()));

  // Issue a certificate with a critical Netscape certificate type extension. We
  // do not recognize this extension, so this certificate should be rejected.
  bssl::UniquePtr<X509> leaf =
      MakeTestCert("Root", "Leaf", key.get(), /*is_ca=*/false);
  ASSERT_TRUE(leaf);
  bssl::UniquePtr<ASN1_BIT_STRING> cert_type(ASN1_BIT_STRING_new());
  ASSERT_TRUE(cert_type);
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(cert_type.get(), /*n=*/0, /*value=*/1));
  ASSERT_TRUE(X509_add1_ext_i2d(leaf.get(), NID_netscape_cert_type,
                                cert_type.get(),
                                /*crit=*/1, /*flags=*/0));
  ASSERT_TRUE(X509_sign(leaf.get(), key.get(), EVP_sha256()));

  EXPECT_EQ(X509_V_ERR_UNHANDLED_CRITICAL_EXTENSION,
            Verify(leaf.get(), {root.get()}, {}, {}));
  EXPECT_EQ(X509_V_OK, Verify(leaf.get(), {root.get()}, {}, {},
                              X509_V_FLAG_IGNORE_CRITICAL));
}